

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlRegAtomPtr xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom)

{
  xmlRegRangePtr pxVar1;
  xmlRegQuantType xVar2;
  int iVar3;
  int iVar4;
  xmlRegAtomType xVar5;
  int iVar6;
  xmlRegAtomPtr atom_00;
  xmlRegRangePtr *ppxVar7;
  xmlRegRangePtr pxVar8;
  xmlChar *pxVar9;
  long lVar10;
  
  atom_00 = (xmlRegAtomPtr)(*xmlMalloc)(0x60);
  if (atom_00 == (xmlRegAtomPtr)0x0) {
    xmlRegexpErrMemory(ctxt,"copying atom");
  }
  else {
    atom_00->ranges = (xmlRegRangePtr *)0x0;
    atom_00->data = (void *)0x0;
    atom_00->stop = (xmlRegStatePtr)0x0;
    atom_00->maxRanges = 0;
    atom_00->nbRanges = 0;
    atom_00->start = (xmlRegStatePtr)0x0;
    atom_00->start0 = (xmlRegStatePtr)0x0;
    atom_00->valuep2 = (void *)0x0;
    atom_00->neg = 0;
    atom_00->codepoint = 0;
    *(undefined8 *)&atom_00->max = 0;
    atom_00->valuep = (void *)0x0;
    atom_00->no = 0;
    atom_00->type = 0;
    atom_00->quant = 0;
    atom_00->min = 0;
    xVar2 = atom->quant;
    iVar3 = atom->min;
    iVar4 = atom->max;
    atom_00->type = atom->type;
    atom_00->quant = xVar2;
    atom_00->min = iVar3;
    atom_00->max = iVar4;
    if ((long)atom->nbRanges < 1) {
      return atom_00;
    }
    ppxVar7 = (xmlRegRangePtr *)(*xmlMalloc)((long)atom->nbRanges << 3);
    atom_00->ranges = ppxVar7;
    if (ppxVar7 != (xmlRegRangePtr *)0x0) {
      if (atom->nbRanges < 1) {
        return atom_00;
      }
      lVar10 = 0;
      do {
        pxVar1 = atom->ranges[lVar10];
        if (pxVar1 == (xmlRegRangePtr)0x0) {
LAB_001ac3dd:
          pxVar8 = (xmlRegRangePtr)0x0;
        }
        else {
          iVar3 = pxVar1->neg;
          xVar5 = pxVar1->type;
          iVar4 = pxVar1->start;
          iVar6 = pxVar1->end;
          pxVar8 = (xmlRegRangePtr)(*xmlMalloc)(0x18);
          if (pxVar8 == (xmlRegRangePtr)0x0) {
            xmlRegexpErrMemory(ctxt,"allocating range");
            goto LAB_001ac3dd;
          }
          pxVar8->neg = iVar3;
          pxVar8->type = xVar5;
          pxVar8->start = iVar4;
          pxVar8->end = iVar6;
          if (pxVar1->blockName != (xmlChar *)0x0) {
            pxVar9 = xmlStrdup(pxVar1->blockName);
            pxVar8->blockName = pxVar9;
            if (pxVar9 == (xmlChar *)0x0) {
              xmlRegexpErrMemory(ctxt,"allocating range");
              if (pxVar8->blockName != (xmlChar *)0x0) {
                (*xmlFree)(pxVar8->blockName);
              }
              (*xmlFree)(pxVar8);
              goto LAB_001ac3dd;
            }
          }
        }
        atom_00->ranges[lVar10] = pxVar8;
        if (atom_00->ranges[lVar10] == (xmlRegRangePtr)0x0) goto LAB_001ac429;
        lVar10 = lVar10 + 1;
        atom_00->nbRanges = (int)lVar10;
        if (atom->nbRanges <= lVar10) {
          return atom_00;
        }
      } while( true );
    }
    xmlRegexpErrMemory(ctxt,"copying atom");
LAB_001ac429:
    xmlRegFreeAtom(atom_00);
  }
  return (xmlRegAtomPtr)0x0;
}

Assistant:

static xmlRegAtomPtr
xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom) {
    xmlRegAtomPtr ret;

    ret = (xmlRegAtomPtr) xmlMalloc(sizeof(xmlRegAtom));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt, "copying atom");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegAtom));
    ret->type = atom->type;
    ret->quant = atom->quant;
    ret->min = atom->min;
    ret->max = atom->max;
    if (atom->nbRanges > 0) {
        int i;

        ret->ranges = (xmlRegRangePtr *) xmlMalloc(sizeof(xmlRegRangePtr) *
	                                           atom->nbRanges);
	if (ret->ranges == NULL) {
	    xmlRegexpErrMemory(ctxt, "copying atom");
	    goto error;
	}
	for (i = 0;i < atom->nbRanges;i++) {
	    ret->ranges[i] = xmlRegCopyRange(ctxt, atom->ranges[i]);
	    if (ret->ranges[i] == NULL)
	        goto error;
	    ret->nbRanges = i + 1;
	}
    }
    return(ret);

error:
    xmlRegFreeAtom(ret);
    return(NULL);
}